

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O0

ROMInfo * MT32Emu::ROMInfo::getROMInfo(File *file,ROMInfo **romInfos)

{
  ROMInfo *pRVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ROMInfo *romInfo;
  Bit32u i;
  size_t fileSize;
  ROMInfo **romInfos_local;
  File *file_local;
  
  iVar2 = (*file->_vptr_File[2])();
  romInfo._4_4_ = 0;
  do {
    if (romInfos[romInfo._4_4_] == (ROMInfo *)0x0) {
      return (ROMInfo *)0x0;
    }
    pRVar1 = romInfos[romInfo._4_4_];
    if (CONCAT44(extraout_var,iVar2) == pRVar1->fileSize) {
      iVar3 = (*file->_vptr_File[4])();
      iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),*pRVar1->sha1Digest);
      if (iVar3 == 0) {
        return pRVar1;
      }
    }
    romInfo._4_4_ = romInfo._4_4_ + 1;
  } while( true );
}

Assistant:

const ROMInfo *ROMInfo::getROMInfo(File *file, const ROMInfo * const *romInfos) {
	size_t fileSize = file->getSize();
	for (Bit32u i = 0; romInfos[i] != NULL; i++) {
		const ROMInfo *romInfo = romInfos[i];
		if (fileSize == romInfo->fileSize && !strcmp(file->getSHA1(), romInfo->sha1Digest)) {
			return romInfo;
		}
	}
	return NULL;
}